

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

void Ree_CollectInsiders_rec(Gia_Man_t *pGia,int iObj,Vec_Bit_t *vVisited,Vec_Bit_t *vInsiders)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int Entry;
  int Entry_00;
  
  iVar1 = Vec_BitEntry(vVisited,iObj);
  if (iVar1 != 0) {
    return;
  }
  Vec_BitSetEntry(vVisited,iObj,Entry);
  pGVar2 = Gia_ManObj(pGia,iObj);
  iVar1 = Gia_ObjId(pGia,pGVar2);
  Ree_CollectInsiders_rec(pGia,iVar1 - (*(uint *)pGVar2 & 0x1fffffff),vVisited,vInsiders);
  pGVar2 = Gia_ManObj(pGia,iObj);
  iVar1 = Gia_ObjId(pGia,pGVar2);
  Ree_CollectInsiders_rec
            (pGia,iVar1 - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff),vVisited,vInsiders);
  Vec_BitSetEntry(vInsiders,iObj,Entry_00);
  return;
}

Assistant:

void Ree_CollectInsiders_rec( Gia_Man_t * pGia, int iObj, Vec_Bit_t * vVisited, Vec_Bit_t * vInsiders )
{
    if ( Vec_BitEntry(vVisited, iObj) )
        return;
    Vec_BitSetEntry( vVisited, iObj, 1 );
    Ree_CollectInsiders_rec( pGia, Gia_ObjFaninId0p(pGia, Gia_ManObj(pGia, iObj)), vVisited, vInsiders );
    Ree_CollectInsiders_rec( pGia, Gia_ObjFaninId1p(pGia, Gia_ManObj(pGia, iObj)), vVisited, vInsiders );
    Vec_BitSetEntry( vInsiders, iObj, 1 );
}